

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void __thiscall
CNetBase::SendControlMsg
          (CNetBase *this,NETADDR *pAddr,TOKEN Token,int Ack,int ControlMsg,void *pExtra,
          int ExtraSize)

{
  long in_FS_OFFSET;
  CNetPacketConstruct local_5a0;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_5a0.m_Flags = 1;
  local_5a0.m_NumChunks = 0;
  local_5a0.m_DataSize = ExtraSize + 1;
  local_5a0.m_aChunkData[0] = (uchar)ControlMsg;
  local_5a0.m_Token = Token;
  local_5a0.m_Ack = Ack;
  if (0 < ExtraSize) {
    mem_copy(local_5a0.m_aChunkData + 1,pExtra,ExtraSize);
  }
  SendPacket(this,pAddr,&local_5a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBase::SendControlMsg(const NETADDR *pAddr, TOKEN Token, int Ack, int ControlMsg, const void *pExtra, int ExtraSize)
{
	CNetPacketConstruct Construct;
	Construct.m_Token = Token;
	Construct.m_Flags = NET_PACKETFLAG_CONTROL;
	Construct.m_Ack = Ack;
	Construct.m_NumChunks = 0;
	Construct.m_DataSize = 1+ExtraSize;
	Construct.m_aChunkData[0] = ControlMsg;
	if(ExtraSize > 0)
		mem_copy(&Construct.m_aChunkData[1], pExtra, ExtraSize);

	// send the control message
	SendPacket(pAddr, &Construct);
}